

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::AddEnumValueInternal
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  FieldType type;
  int number;
  bool packed;
  uint32_t uVar1;
  RepeatedField<int> *this_00;
  
  if ((field->field_0x1 & 8) == 0) {
    VerifyFieldType<google::protobuf::RepeatedField<int>>(this,field);
    this_00 = (RepeatedField<int> *)MutableRawImpl(this,message,field);
    RepeatedField<int>::Add(this_00,value);
    return;
  }
  uVar1 = protobuf::internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
  number = field->number_;
  type = field->type_;
  packed = FieldDescriptor::is_packed(field);
  protobuf::internal::ExtensionSet::AddEnum
            ((ExtensionSet *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),
             number,type,packed,value,field);
  return;
}

Assistant:

void Reflection::AddEnumValueInternal(Message* message,
                                      const FieldDescriptor* field,
                                      int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->AddEnum(field->number(), field->type(),
                                          field->is_packed(), value, field);
  } else {
    AddField<int>(message, field, value);
  }
}